

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack3_16(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 7;
  out[1] = *in >> 3 & 7;
  out[2] = *in >> 6 & 7;
  out[3] = *in >> 9 & 7;
  out[4] = *in >> 0xc & 7;
  out[5] = *in >> 0xf & 7;
  out[6] = *in >> 0x12 & 7;
  out[7] = *in >> 0x15 & 7;
  out[8] = *in >> 0x18 & 7;
  out[9] = *in >> 0x1b & 7;
  puVar1 = out + 10;
  *puVar1 = *in >> 0x1e;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 1) << 2 | *puVar1;
  out[0xb] = *puVar2 >> 1 & 7;
  out[0xc] = *puVar2 >> 4 & 7;
  out[0xd] = *puVar2 >> 7 & 7;
  out[0xe] = *puVar2 >> 10 & 7;
  out[0xf] = *puVar2 >> 0xd & 7;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack3_16(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 3);
  out++;
  *out = ((*in) >> 3) % (1U << 3);
  out++;
  *out = ((*in) >> 6) % (1U << 3);
  out++;
  *out = ((*in) >> 9) % (1U << 3);
  out++;
  *out = ((*in) >> 12) % (1U << 3);
  out++;
  *out = ((*in) >> 15) % (1U << 3);
  out++;
  *out = ((*in) >> 18) % (1U << 3);
  out++;
  *out = ((*in) >> 21) % (1U << 3);
  out++;
  *out = ((*in) >> 24) % (1U << 3);
  out++;
  *out = ((*in) >> 27) % (1U << 3);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 1)) << (3 - 1);
  out++;
  *out = ((*in) >> 1) % (1U << 3);
  out++;
  *out = ((*in) >> 4) % (1U << 3);
  out++;
  *out = ((*in) >> 7) % (1U << 3);
  out++;
  *out = ((*in) >> 10) % (1U << 3);
  out++;
  *out = ((*in) >> 13) % (1U << 3);
  out++;

  return in + 1;
}